

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCacheCommand.cxx
# Opt level: O1

void CheckLine(cmMakefile *mf,string *prefix,
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *variablesToRead,char *line)

{
  bool bVar1;
  const_iterator cVar2;
  string_view value_00;
  CacheEntryType type;
  string var;
  string value;
  allocator<char> local_95;
  CacheEntryType local_94;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_94 = UNINITIALIZED;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,line,&local_95);
  bVar1 = cmake::ParseCacheEntry(&local_70,&local_90,&local_50,&local_94);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&variablesToRead->_M_t,&local_90);
    if ((_Rb_tree_header *)cVar2._M_node != &(variablesToRead->_M_t)._M_impl.super__Rb_tree_header)
    {
      std::operator+(&local_70,prefix,&local_90);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (local_50._M_string_length == 0) {
        cmMakefile::RemoveDefinition(mf,&local_90);
      }
      else {
        value_00._M_str = local_50._M_dataplus._M_p;
        value_00._M_len = local_50._M_string_length;
        cmMakefile::AddDefinition(mf,&local_90,value_00);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

static void CheckLine(cmMakefile& mf, std::string const& prefix,
                      std::set<std::string> const& variablesToRead,
                      const char* line)
{
  // Check one line of the cache file.
  std::string var;
  std::string value;
  cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
  if (cmake::ParseCacheEntry(line, var, value, type)) {
    // Found a real entry.  See if this one was requested.
    if (variablesToRead.find(var) != variablesToRead.end()) {
      // This was requested.  Set this variable locally with the given
      // prefix.
      var = prefix + var;
      if (!value.empty()) {
        mf.AddDefinition(var, value);
      } else {
        mf.RemoveDefinition(var);
      }
    }
  }
}